

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall cmCTestRunTest::CompressOutput(cmCTestRunTest *this)

{
  size_type sVar1;
  Bytef *pBVar2;
  cmCTest *this_00;
  int iVar3;
  uchar *input;
  uchar *output;
  size_t sVar4;
  ostream *poVar5;
  uInt uVar6;
  size_t i;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char *local_238 [4];
  z_stream_conflict local_218;
  ostringstream cmCTestLog_msg;
  
  sVar1 = (this->ProcessOutput)._M_string_length;
  pBVar2 = (Bytef *)(this->ProcessOutput)._M_dataplus._M_p;
  uVar6 = (uInt)((((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.001 + 13.0);
  input = (uchar *)operator_new__((long)(int)uVar6);
  local_218.zalloc = (alloc_func)0x0;
  local_218.zfree = (free_func)0x0;
  local_218.opaque = (voidpf)0x0;
  iVar3 = cm_zlib_deflateInit_(&local_218,-1,"1.2.3",0x70);
  if (iVar3 == 0) {
    local_218.avail_in = (uInt)(this->ProcessOutput)._M_string_length;
    local_218.next_in = pBVar2;
    local_218.next_out = input;
    local_218.avail_out = uVar6;
    iVar3 = cm_zlib_deflate(&local_218,4);
    if (iVar3 == 1) {
      cm_zlib_deflateEnd(&local_218);
      output = (uchar *)operator_new__((long)(int)((double)(int)uVar6 * 1.5));
      sVar4 = cmsysBase64_Encode(input,local_218.total_out,output,1);
      for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
        std::__cxx11::string::push_back((char)this + 'h');
      }
      if (local_218.total_in != 0) {
        auVar8._8_4_ = (int)(local_218.total_out >> 0x20);
        auVar8._0_8_ = local_218.total_out;
        auVar8._12_4_ = 0x45300000;
        auVar9._8_4_ = (int)(local_218.total_in >> 0x20);
        auVar9._0_8_ = local_218.total_in;
        auVar9._12_4_ = 0x45300000;
        this->CompressionRatio =
             ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_218.total_out) - 4503599627370496.0)) /
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_218.total_in) - 4503599627370496.0));
      }
      operator_delete__(output);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "Error during output compression. Sending uncompressed output.");
      std::endl<char,std::char_traits<char>>(poVar5);
      this_00 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x6f,local_238[0],false);
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
  }
  operator_delete__(input);
  return;
}

Assistant:

void cmCTestRunTest::CompressOutput()
{
  int ret;
  z_stream strm;

  unsigned char* in =
    reinterpret_cast<unsigned char*>(
    const_cast<char*>(this->ProcessOutput.c_str()));
  //zlib makes the guarantee that this is the maximum output size
  int outSize = static_cast<int>(
    static_cast<double>(this->ProcessOutput.size()) * 1.001 + 13.0);
  unsigned char* out = new unsigned char[outSize];

  strm.zalloc = Z_NULL;
  strm.zfree = Z_NULL;
  strm.opaque = Z_NULL;
  ret = deflateInit(&strm, -1); //default compression level
  if (ret != Z_OK)
    {
    delete[] out;
    return;
    }

  strm.avail_in = static_cast<uInt>(this->ProcessOutput.size());
  strm.next_in = in;
  strm.avail_out = outSize;
  strm.next_out = out;
  ret = deflate(&strm, Z_FINISH);

  if(ret == Z_STREAM_ERROR || ret != Z_STREAM_END)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error during output "
      "compression. Sending uncompressed output." << std::endl);
    delete[] out;
    return;
    }

  (void)deflateEnd(&strm);

  unsigned char *encoded_buffer
    = new unsigned char[static_cast<int>(outSize * 1.5)];

  size_t rlen
    = cmsysBase64_Encode(out, strm.total_out, encoded_buffer, 1);

  for(size_t i = 0; i < rlen; i++)
    {
    this->CompressedOutput += encoded_buffer[i];
    }

  if(strm.total_in)
    {
    this->CompressionRatio = static_cast<double>(strm.total_out) /
                             static_cast<double>(strm.total_in);
    }

  delete [] encoded_buffer;
  delete [] out;
}